

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::registerAward(Map *this,char type,int duration)

{
  int iVar1;
  Award *pAVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  int duration_local;
  char type_local;
  Map *this_local;
  
  local_1c = 0;
  while( true ) {
    if (0x13 < local_1c) {
      local_20 = 0;
      while( true ) {
        if (0x13 < local_20) {
          return;
        }
        if (this->award[local_20] == (Award *)0x0) break;
        local_20 = local_20 + 1;
      }
      pAVar2 = (Award *)malloc(0xc);
      this->award[local_20] = pAVar2;
      iVar1 = SDL_GetTicks();
      this->award[local_20]->activationTime = iVar1;
      this->award[local_20]->type = type;
      this->award[local_20]->duration = duration;
      return;
    }
    if ((this->award[local_1c] != (Award *)0x0) && (this->award[local_1c]->type == type)) break;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Map::registerAward(char type, int duration){
    for(int i=0; i< MAX_AWARDS; i++){
        if(award[i] && award[i]->type == type){
            return;
        }
    }
    for(int i=0; i< MAX_AWARDS; i++){
        if(!award[i]){
            award[i] = (Award *)malloc(sizeof(Award));
            award[i]->activationTime = SDL_GetTicks();
            award[i]->type = type;
            award[i]->duration = duration;
            break;
        }
    }
}